

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2992::OutputRedirectTest_RestoreAndRead_Test::
~OutputRedirectTest_RestoreAndRead_Test(OutputRedirectTest_RestoreAndRead_Test *this)

{
  void *in_RDI;
  
  ~OutputRedirectTest_RestoreAndRead_Test((OutputRedirectTest_RestoreAndRead_Test *)0x120608);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(OutputRedirectTest, RestoreAndRead) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  buffered_file file(write_end.fdopen("w"));
  std::fprintf(file.get(), "[[[");
  OutputRedirect redir(file.get());
  std::fprintf(file.get(), "censored");
  EXPECT_EQ("censored", sanitize(redir.restore_and_read()));
  EXPECT_EQ("", sanitize(redir.restore_and_read()));
  std::fprintf(file.get(), "]]]");
  file = buffered_file();
  EXPECT_READ(read_end, "[[[]]]");
}